

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O3

ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
* __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::operator=(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *this,ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  
  if (this != rhs) {
    reSize(this,rhs->thesize);
    if (0 < this->thesize) {
      lVar8 = 0x38;
      lVar9 = 0;
      do {
        pNVar3 = rhs->data;
        pNVar4 = this->data;
        *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x18) =
             *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0x18);
        puVar1 = (undefined8 *)((long)(&pNVar3->val + -1) + lVar8);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)(&(pNVar3->val).m_backend.data + -1) + lVar8);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar1 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar8);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0x10) =
             *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0x10);
        *(undefined1 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -0xc) =
             *(undefined1 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -0xc);
        *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8 + -8) =
             *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8 + -8);
        *(undefined4 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar8) =
             *(undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8);
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x3c;
      } while (lVar9 < this->thesize);
    }
  }
  return this;
}

Assistant:

ClassArray& operator=(const ClassArray& rhs)
   {
      if(this != &rhs)
      {
         reSize(rhs.size());

         for(int i = 0; i < size(); i++)
            data[i] = rhs.data[i];

         assert(isConsistent());
      }

      return *this;
   }